

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

method_base * __thiscall
cs::stack_type<cs::method_base_*,_std::allocator>::pop
          (stack_type<cs::method_base_*,_std::allocator> *this)

{
  method_base *pmVar1;
  bool bVar2;
  error *this_00;
  stack_type<cs::method_base_*,_std::allocator> *in_RDI;
  method_base *data;
  string *in_stack_ffffffffffffff98;
  allocator local_29;
  string local_28 [40];
  
  bVar2 = empty(in_RDI);
  if (!bVar2) {
    pmVar1 = *in_RDI->m_current;
    in_RDI->m_current = in_RDI->m_current + -1;
    return pmVar1;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"E000H",&local_29);
  cov::error::error(this_00,in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline T pop()
		{
			if (empty())
				throw cov::error("E000H");
			T data(std::move(*m_current));
			(m_current - 1)->~T();
			--m_current;
			return std::move(data);
		}